

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,ReturnNode *returnNode)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ExpNode *pEVar6;
  TokenNode *pTVar7;
  int iVar8;
  ulong uVar9;
  char *__format;
  bool bVar10;
  
  pEVar6 = returnNode->exp;
  if (pEVar6 == (ExpNode *)0x0) {
    uVar9 = (ulong)(uint)(returnNode->super_StmtNode).super_ASTNode.line;
    __format = "[SEMANTIC ERROR - returnNode] VOID RETURN STATEMENT NOT ALLOWED, line: %d\n";
  }
  else {
    (*(pEVar6->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar6,this);
    if (activeFunction == (FunctionSymbol *)0x0) {
      uVar9 = (ulong)(uint)(returnNode->super_StmtNode).super_ASTNode.line;
      __format = "[SEMANTIC ERROR - returnNode] RETURN STATEMENT OUTSIDE A FUNCTION, line: %d\n";
    }
    else {
      pEVar6 = returnNode->exp;
      iVar3 = pEVar6->type;
      pTVar7 = activeFunction->returnType->id;
      iVar4 = pTVar7->token;
      iVar5 = pEVar6->arraySize;
      bVar1 = pEVar6->pointer;
      bVar2 = activeFunction->pointer;
      if (iVar3 == 10) {
        iVar8 = strcmp(pEVar6->typeLexeme,(pTVar7->super_ExpNode).typeLexeme);
        bVar10 = iVar8 != 0;
      }
      else {
        bVar10 = false;
      }
      if ((((iVar3 == iVar4) && (iVar5 < 0)) && (bVar1 == bVar2)) && (!bVar10)) {
        (returnNode->super_StmtNode).super_ASTNode.field_0xc = 1;
        return;
      }
      uVar9 = (ulong)(uint)(returnNode->super_StmtNode).super_ASTNode.line;
      __format = 
      "[SEMANTIC ERROR - returnNode] RETURN TYPE DOES NOT MATCH WITH FUNCTION RETURN TYPE, line: %d\n"
      ;
    }
  }
  fprintf(_stderr,__format,uVar9);
  return;
}

Assistant:

void SemanticTypes::visit(ReturnNode *returnNode) {
    if (returnNode->getExp()) { //Check the return expression
        returnNode->getExp()->accept(this);
    } else { //No expression means void return

        fprintf(stderr,
                "[SEMANTIC ERROR - returnNode] VOID RETURN STATEMENT NOT ALLOWED, line: %d\n",
                returnNode->getLine());


        return;
    }

    if (!activeFunction) {
        fprintf(stderr,
                "[SEMANTIC ERROR - returnNode] RETURN STATEMENT OUTSIDE A FUNCTION, line: %d\n",
                returnNode->getLine());
        return;
    }


    bool isSameType = returnNode->getExp()->getType() ==
                      activeFunction->getReturnType()->getType();

    bool isSameArray = returnNode->getExp()->getArraySize() < 0;
    bool isSamePointer = returnNode->getExp()->isPointer() == activeFunction->isPointer();
    bool isSameTypeLexeme = true;
    if (returnNode->getExp()->getType() == ID)
        isSameTypeLexeme = !strcmp(returnNode->getExp()->getTypeLexeme(),
                                   activeFunction->getReturnType()->getTypeLexeme());

    if (!(isSameArray && isSameType && isSamePointer && isSameTypeLexeme)) {
        fprintf(stderr,
                "[SEMANTIC ERROR - returnNode] RETURN TYPE DOES NOT MATCH WITH FUNCTION RETURN TYPE, line: %d\n",
                returnNode->getLine());
        return;
    }

    returnNode->setReturn(true);
}